

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  int local_28;
  int local_24;
  int opt;
  int seedval;
  int totalrandno;
  bool generaterandno;
  bool bintorand;
  bool skipheader;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  seedval._3_1_ = 0;
  seedval._2_1_ = 0;
  seedval._1_1_ = 0;
  opt = 0;
  local_24 = 0;
  _totalrandno = argv;
  argv_local._0_4_ = argc;
  do {
    local_28 = getopt((int)argv_local,_totalrandno,"vhsrg:S:");
    if (local_28 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"",&local_49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"",&local_81);
      initstreams((string *)local_48,(string *)local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if ((seedval._2_1_ & 1) == 1) {
        doit((bool)(seedval._3_1_ & 1));
        argv_local._4_4_ = 0;
      }
      else if ((seedval._1_1_ & 1) == 1) {
        genrandomnumbers((bool)(seedval._3_1_ & 1),opt,local_24);
        argv_local._4_4_ = 0;
      }
      return argv_local._4_4_;
    }
    switch(local_28) {
    case 0x53:
      local_24 = atoi(_optarg);
      break;
    case 0x67:
      seedval._1_1_ = 1;
      opt = atoi(_optarg);
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x72:
      seedval._2_1_ = 1;
      break;
    case 0x73:
      seedval._3_1_ = 1;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*_totalrandno,"");
      exit(1);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	bool skipheader = false;
	bool bintorand = false;
	bool generaterandno = false;
	int totalrandno = 0;
	int seedval = 0;
	int opt;
	while ((opt = getopt(argc, argv, "vhsrg:S:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'r':
			bintorand = true;
			break;
		case 'g':
			generaterandno = true;
			totalrandno = atoi(optarg);
			break;
		case 'S':
			seedval = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}


	initstreams("", "");
	if (bintorand == true) {
		doit(skipheader);
		return EXIT_SUCCESS;
	}

	if (generaterandno == true) {
		genrandomnumbers(skipheader,totalrandno,seedval);
		return EXIT_SUCCESS;
	}
    
}